

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Bits testing::internal::FloatingPoint<double>::DistanceBetweenSignAndMagnitudeNumbers
               (Bits *sam1,Bits *sam2)

{
  ulong uVar1;
  ulong uVar2;
  Bits BVar3;
  ulong uVar4;
  
  uVar4 = *sam1;
  uVar1 = *sam2;
  uVar2 = uVar4 | 0x8000000000000000;
  if ((long)uVar4 < 0) {
    uVar2 = -uVar4;
  }
  uVar4 = uVar1 | 0x8000000000000000;
  if ((long)uVar1 < 0) {
    uVar4 = -uVar1;
  }
  BVar3 = uVar2 - uVar4;
  if (uVar2 < uVar4) {
    BVar3 = -(uVar2 - uVar4);
  }
  return BVar3;
}

Assistant:

static Bits SignAndMagnitudeToBiased(const Bits &sam) {
    if (kSignBitMask & sam) {
      // sam represents a negative number.
      return ~sam + 1;
    } else {
      // sam represents a positive number.
      return kSignBitMask | sam;
    }
  }